

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestSuite::~TestSuite(TestSuite *this)

{
  TestResult *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  
  (in_RDI->test_properties_mutex_).super_MutexBase.mutex_.__align = (long)&PTR__TestSuite_001bbd98;
  internal::
  ForEach<std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>,void(*)(testing::TestInfo*)>
            ((vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *)unaff_retaddr,
             (_func_void_TestInfo_ptr *)in_RDI);
  TestResult::~TestResult(in_RDI);
  std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::~vector
            ((vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *)unaff_retaddr);
  std::
  unique_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_RDI);
  std::__cxx11::string::~string
            ((string *)((in_RDI->test_properties_mutex_).super_MutexBase.mutex_.__size + 8));
  return;
}

Assistant:

TestSuite::~TestSuite() {
  // Deletes every Test in the collection.
  ForEach(test_info_list_, internal::Delete<TestInfo>);
}